

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::~GraphCycles(GraphCycles *this)

{
  Rep *this_00;
  Node *this_01;
  Node **ppNVar1;
  Node *node;
  Node **__end2;
  Node **__begin2;
  Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*> *__range2;
  GraphCycles *this_local;
  
  this_00 = this->rep_;
  __end2 = synchronization_internal::anon_unknown_0::
           Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::begin
                     (&this_00->nodes_);
  ppNVar1 = synchronization_internal::anon_unknown_0::
            Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::end
                      (&this_00->nodes_);
  for (; __end2 != ppNVar1; __end2 = __end2 + 1) {
    this_01 = *__end2;
    if (this_01 != (Node *)0x0) {
      synchronization_internal::anon_unknown_0::Node::~Node(this_01);
      base_internal::LowLevelAlloc::Free(this_01);
    }
  }
  Rep::~Rep(this->rep_);
  base_internal::LowLevelAlloc::Free(this->rep_);
  return;
}

Assistant:

GraphCycles::~GraphCycles() {
  for (auto* node : rep_->nodes_) {
    if (node == nullptr) { continue; }
    node->Node::~Node();
    base_internal::LowLevelAlloc::Free(node);
  }
  rep_->Rep::~Rep();
  base_internal::LowLevelAlloc::Free(rep_);
}